

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O2

bool __thiscall
nowide::basic_stackstring<char,_wchar_t,_5UL>::convert
          (basic_stackstring<char,_wchar_t,_5UL> *this,input_char_conflict *begin,
          input_char_conflict *end)

{
  basic_stackstring<char,_wchar_t,_5UL> *buffer;
  char *pcVar1;
  size_t buffer_size;
  
  clear(this);
  buffer_size = (long)end + (1 - (long)begin);
  if (buffer_size < 6) {
    buffer_size = 5;
    buffer = this;
  }
  else {
    buffer = (basic_stackstring<char,_wchar_t,_5UL> *)operator_new__(buffer_size);
    this->mem_buffer_ = (output_char_conflict *)buffer;
  }
  pcVar1 = basic_convert<char,wchar_t>(buffer->buffer_,buffer_size,begin,end);
  if (pcVar1 == (char *)0x0) {
    clear(this);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool convert(input_char const *begin,input_char const *end)
    {
        clear();

        size_t space = get_space(sizeof(input_char),sizeof(output_char),end - begin) + 1;
        if(space <= buffer_size) {
            if(basic_convert(buffer_,buffer_size,begin,end))
                return true;
            clear();
            return false;
        }
        else {
            mem_buffer_ = new output_char[space];
            if(!basic_convert(mem_buffer_,space,begin,end)) {
                clear();
                return false;
            }
            return true;
        }

    }